

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

bool __thiscall cali::Node::equals(Node *this,cali_id_t attr,Variant *v)

{
  uint64_t uVar1;
  _Bool _Var2;
  cali_variant_t lhs;
  cali_variant_t rhs;
  
  uVar1 = (this->m_data).m_v.type_and_size;
  if (uVar1 == (v->m_v).type_and_size) {
    lhs.value.v_uint = (this->m_data).m_v.value.v_uint;
    lhs.type_and_size = uVar1;
    rhs.value.v_uint = (v->m_v).value.v_uint;
    rhs.type_and_size = uVar1;
    _Var2 = _cali_variant_value_eq(lhs,rhs);
  }
  else {
    _Var2 = false;
  }
  return (bool)(this->m_attribute == attr & _Var2);
}

Assistant:

bool equals(cali_id_t attr, const Variant& v) const { return m_data == v && m_attribute == attr; }